

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_type.hxx
# Opt level: O3

string * __thiscall
nuraft::msg_type_to_string_abi_cxx11_(string *__return_storage_ptr__,nuraft *this,msg_type type)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  ulong uVar8;
  uint __val;
  char *pcVar9;
  uint uVar10;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar10 = (uint)this;
  switch(uVar10) {
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "request_vote_request";
    pcVar7 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "request_vote_response";
    pcVar7 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "append_entries_request";
    pcVar7 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "append_entries_response";
    pcVar7 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "client_request";
    pcVar7 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "add_server_request";
    pcVar7 = "";
    break;
  case 7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "add_server_response";
    pcVar7 = "";
    break;
  case 8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "remove_server_request";
    pcVar7 = "";
    break;
  case 9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "remove_server_response";
    pcVar7 = "";
    break;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "sync_log_request";
    pcVar7 = "";
    break;
  case 0xb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "sync_log_response";
    pcVar7 = "";
    break;
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "join_cluster_request";
    pcVar7 = "";
    break;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "join_cluster_response";
    pcVar7 = "";
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "leave_cluster_request";
    pcVar7 = "";
    break;
  case 0xf:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "leave_cluster_response";
    pcVar7 = "";
    break;
  case 0x10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "install_snapshot_request";
    pcVar7 = "";
    break;
  case 0x11:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "install_snapshot_response";
    pcVar7 = "";
    break;
  case 0x12:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "ping_request";
    pcVar7 = "";
    break;
  case 0x13:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "ping_response";
    pcVar7 = "";
    break;
  case 0x14:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "pre_vote_request";
    pcVar7 = "";
    break;
  case 0x15:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "pre_vote_response";
    pcVar7 = "";
    break;
  case 0x16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "other_request";
    pcVar7 = "";
    break;
  case 0x17:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "other_response";
    pcVar7 = "";
    break;
  case 0x18:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "priority_change_request";
    pcVar7 = "";
    break;
  case 0x19:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "priority_change_response";
    pcVar7 = "";
    break;
  case 0x1a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "reconnect_request";
    pcVar7 = "";
    break;
  case 0x1b:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "reconnect_response";
    pcVar7 = "";
    break;
  case 0x1c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "custom_notification_request";
    pcVar7 = "";
    break;
  case 0x1d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "custom_notification_response";
    pcVar7 = "";
    break;
  default:
    __val = -uVar10;
    if (0 < (int)uVar10) {
      __val = uVar10;
    }
    uVar10 = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        uVar10 = uVar2;
        uVar4 = (uint)uVar8;
        if (uVar4 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_0011fdc0;
        }
        if (uVar4 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_0011fdc0;
        }
        if (uVar4 < 10000) goto LAB_0011fdc0;
        uVar8 = uVar8 / 10000;
        uVar2 = uVar10 + 4;
      } while (99999 < uVar4);
      uVar10 = uVar10 + 1;
    }
LAB_0011fdc0:
    uVar8 = (ulong)this >> 0x1f & 1;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar10 + (char)uVar8);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + uVar8,uVar10,__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x15cc74);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_60 = *plVar5;
      lStack_58 = plVar3[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar5;
      local_70 = (long *)*plVar3;
    }
    local_68 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50[0] == local_40) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50[0]);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar7);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ATTR_UNUSED msg_type_to_string(msg_type type) {
    switch (type) {
    case request_vote_request:          return "request_vote_request";
    case request_vote_response:         return "request_vote_response";
    case append_entries_request:        return "append_entries_request";
    case append_entries_response:       return "append_entries_response";
    case client_request:                return "client_request";
    case add_server_request:            return "add_server_request";
    case add_server_response:           return "add_server_response";
    case remove_server_request:         return "remove_server_request";
    case remove_server_response:        return "remove_server_response";
    case sync_log_request:              return "sync_log_request";
    case sync_log_response:             return "sync_log_response";
    case join_cluster_request:          return "join_cluster_request";
    case join_cluster_response:         return "join_cluster_response";
    case leave_cluster_request:         return "leave_cluster_request";
    case leave_cluster_response:        return "leave_cluster_response";
    case install_snapshot_request:      return "install_snapshot_request";
    case install_snapshot_response:     return "install_snapshot_response";
    case ping_request:                  return "ping_request";
    case ping_response:                 return "ping_response";
    case pre_vote_request:              return "pre_vote_request";
    case pre_vote_response:             return "pre_vote_response";
    case other_request:                 return "other_request";
    case other_response:                return "other_response";
    case priority_change_request:       return "priority_change_request";
    case priority_change_response:      return "priority_change_response";
    case reconnect_request:             return "reconnect_request";
    case reconnect_response:            return "reconnect_response";
    case custom_notification_request:   return "custom_notification_request";
    case custom_notification_response:  return "custom_notification_response";
    default:
        return "unknown (" + std::to_string(static_cast<int>(type)) + ")";
    }
}